

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

uint32_t getFoldedValue(UNewTrie *trie,UChar32 start,int32_t offset)

{
  char local_29;
  int local_28;
  uint32_t uStack_24;
  UBool inBlockZero;
  UChar32 limit;
  uint32_t value;
  int32_t offset_local;
  UChar32 start_local;
  UNewTrie *trie_local;
  
  local_28 = start + 0x400;
  limit = offset;
  value = start;
  _offset_local = trie;
  while( true ) {
    while( true ) {
      if (local_28 <= (int)value) {
        return 0;
      }
      uStack_24 = utrie_get32_63(_offset_local,value,&local_29);
      if (local_29 == '\0') break;
      value = value + 0x20;
    }
    if (uStack_24 != 0) break;
    value = value + 1;
  }
  return limit;
}

Assistant:

static uint32_t U_CALLCONV
getFoldedValue(UNewTrie *trie, UChar32 start, int32_t offset) {
    uint32_t value;
    UChar32 limit=0;
    UBool inBlockZero;

    limit=start+0x400;
    while(start<limit) {
        value=utrie_get32(trie, start, &inBlockZero);
        if(inBlockZero) {
            start+=UTRIE_DATA_BLOCK_LENGTH;
        } else if(value!=0) {
            return (uint32_t)offset;
        } else {
            ++start;
        }
    }
    return 0;

}